

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

bool soplex::LPFhasKeyword(char **pos,char *keyword)

{
  long lVar1;
  char cVar2;
  byte bVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  char *pcVar12;
  int iVar13;
  
  pcVar4 = *pos;
  iVar13 = 0;
  iVar9 = 0;
  do {
    lVar10 = (long)iVar13;
    cVar2 = keyword[lVar10];
    if (cVar2 == '[') {
      pcVar6 = keyword + (iVar13 + 1);
      lVar11 = 0;
      iVar7 = iVar13;
      do {
        iVar13 = iVar7;
        pcVar12 = pcVar6;
        cVar2 = pcVar4[lVar11 + iVar9];
        iVar8 = tolower((int)cVar2);
        lVar1 = lVar11 + 1;
        if (cVar2 == '\0') break;
        lVar5 = lVar11 + lVar10 + 1;
        pcVar6 = pcVar12 + 1;
        lVar11 = lVar1;
        iVar7 = iVar13 + 1;
      } while (iVar8 == keyword[lVar5]);
      do {
        iVar13 = iVar13 + 1;
        cVar2 = *pcVar12;
        pcVar12 = pcVar12 + 1;
      } while (cVar2 != ']');
      iVar9 = iVar9 + (int)lVar1 + -2;
    }
    else {
      if (cVar2 == '\0') goto LAB_0017715e;
      iVar7 = tolower((int)pcVar4[iVar9]);
      if (iVar7 != cVar2) {
        if (cVar2 == '\0') {
LAB_0017715e:
          bVar3 = (*pos)[iVar9];
          if ((((ulong)bVar3 < 0x21) && ((0x100002601U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) ||
             ((byte)(bVar3 - 0x3c) < 3)) {
            *pos = *pos + iVar9;
            return true;
          }
        }
        return false;
      }
    }
    iVar13 = iVar13 + 1;
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

static inline bool LPFhasKeyword(char*& pos, const char* keyword)
{
   int i;
   int k;

   assert(keyword != nullptr);

   for(i = 0, k = 0; keyword[i] != '\0'; i++, k++)
   {
      if(keyword[i] == '[')
      {
         i++;

         // Here we assumed that we have a ']' for the '['.
         while((tolower(pos[k]) == keyword[i]) && (pos[k] != '\0'))
         {
            k++;
            i++;
         }

         while(keyword[i] != ']')
            i++;

         --k;
      }
      else
      {
         if(keyword[i] != tolower(pos[k]))
            break;
      }
   }

   // we have to be at the end of the keyword and the word found on the line also has to end here.  Attention: The
   // LPFisSense is a kludge to allow LPFhasKeyword also to process Inf[inity] keywords in the bounds section.
   if(keyword[i] == '\0' && (pos[k] == '\0' || LPFisSpace(pos[k]) || LPFisSense(&pos[k])))
   {
      pos += k;

      return true;
   }

   return false;
}